

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::addRowReal(SoPlexBase<double> *this,LPRowBase<double> *lprow)

{
  int iVar1;
  SoPlexBase<double> *in_RDI;
  SoPlexBase<double> *in_stack_fffffffffffffee0;
  LPRowBase<double> *in_stack_fffffffffffffee8;
  undefined1 *puVar2;
  undefined1 local_f8 [24];
  SoPlexBase<double> *in_stack_ffffffffffffff20;
  LPRowBase<double> *in_stack_ffffffffffffff58;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_ffffffffffffff60;
  
  _addRowReal(in_RDI,in_stack_fffffffffffffee8);
  iVar1 = intParam(in_RDI,SYNCMODE);
  if (iVar1 == 1) {
    in_stack_fffffffffffffee0 = (SoPlexBase<double> *)in_RDI->_rationalLP;
    puVar2 = local_f8;
    LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::LPRowBase<double>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    (**(code **)(*(long *)&(((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)&in_stack_fffffffffffffee0->_vptr_SoPlexBase)->m_backend).m_value.
                           num.m_backend.
                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           .m_data + 0x28))(in_stack_fffffffffffffee0,puVar2,0);
    LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffffee0);
    _completeRangeTypesRational(in_stack_ffffffffffffff20);
  }
  _invalidateSolution(in_stack_fffffffffffffee0);
  return;
}

Assistant:

void SoPlexBase<R>::addRowReal(const LPRowBase<R>& lprow)
{
   assert(_realLP != nullptr);

   _addRowReal(lprow);

   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_AUTO)
   {
      _rationalLP->addRow(lprow);
      _completeRangeTypesRational();
   }

   _invalidateSolution();
}